

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitIdentifierExpression
          (MethodSemanticAnalysis *this,IdentifierExpression *node)

{
  int iVar1;
  string *psVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  VariableLookupPtr variable;
  VariableLookupPtr local_30;
  
  symbol = (anon_union_8_4_0eb573b0_for_Oop_0)
           (this->super_ScopedInterpreter).currentScope.
           super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  AST::IdentifierExpression::getSymbol(node);
  EvaluationScope::lookSymbolRecursively((EvaluationScope *)&local_30,(Oop)symbol);
  if (local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = (*(local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_VariableLookup[2])
                      (local_30.
                       super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if ((char)iVar1 != '\0') {
      if ((element_type *)
          local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((EvaluationScopePtr *)
                    &(local_30.
                      super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->
                   super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               = *(int *)&(((EvaluationScopePtr *)
                           &(local_30.
                             super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->
                          super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((EvaluationScopePtr *)
                    &(local_30.
                      super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->
                   super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               = *(int *)&(((EvaluationScopePtr *)
                           &(local_30.
                             super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->
                          super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1;
        }
      }
      if ((Node *)local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[2]._vptr_VariableLookup != this->localContext) {
        *(undefined1 *)
         ((long)&local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[3]._vptr_VariableLookup + 1) = 1;
      }
      if ((element_type *)
          local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    AST::IdentifierExpression::setVariable(node,&local_30);
    if ((element_type *)
        local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (Oop)&NilObject;
  }
  psVar2 = AST::IdentifierExpression::getIdentifier_abi_cxx11_(node);
  AbstractASTVisitor::error
            ((AbstractASTVisitor *)node,(Node *)symbol.header,"undeclared identifier \'%s\'.",
             (psVar2->_M_dataplus)._M_p);
}

Assistant:

Oop MethodSemanticAnalysis::visitIdentifierExpression(IdentifierExpression *node)
{
    // Find the variable
    auto variable = currentScope->lookSymbolRecursively(node->getSymbol());
    if(!variable)
        error(node, "undeclared identifier '%s'.", node->getIdentifier().c_str());

    // Check the variable context, for marking the closure.
    if(variable->isTemporal())
    {
        auto temporal = std::static_pointer_cast<TemporalVariableLookup> (variable);
        if(temporal->getLocalContext() != localContext)
            temporal->setCapturedInClosure(true);
    }

    node->setVariable(variable);

    return Oop();
}